

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::current_path(path *__return_storage_ptr__,error_code *ec)

{
  ulong uVar1;
  tuple<char_*,_std::default_delete<char[]>_> __buf;
  char *pcVar2;
  size_t __size;
  error_code eVar3;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_28;
  
  std::error_code::clear(ec);
  uVar1 = pathconf(".",4);
  __size = 0x1000;
  if (0x1000 < (int)uVar1) {
    __size = uVar1 & 0xffffffff;
  }
  __buf.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)_end(__size + 1);
  buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __buf.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  pcVar2 = getcwd((char *)__buf.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl,__size);
  if (pcVar2 == (char *)0x0) {
    eVar3 = detail::make_system_error(0);
    ec->_M_value = eVar3._M_value;
    ec->_M_cat = eVar3._M_cat;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_28._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)
         __buf.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    path::path<char*,ghc::filesystem::path>(__return_storage_ptr__,(char **)&local_28,auto_format);
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buffer);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path current_path(std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    DWORD pathlen = ::GetCurrentDirectoryW(0, 0);
    std::unique_ptr<wchar_t[]> buffer(new wchar_t[size_t(pathlen) + 1]);
    if (::GetCurrentDirectoryW(pathlen, buffer.get()) == 0) {
        ec = detail::make_system_error();
        return path();
    }
    return path(std::wstring(buffer.get()), path::native_format);
#else
    size_t pathlen = static_cast<size_t>(std::max(int(::pathconf(".", _PC_PATH_MAX)), int(PATH_MAX)));
    std::unique_ptr<char[]> buffer(new char[pathlen + 1]);
    if (::getcwd(buffer.get(), pathlen) == nullptr) {
        ec = detail::make_system_error();
        return path();
    }
    return path(buffer.get());
#endif
}